

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplaceRealloc<slang::Diagnostic>
          (SmallVectorBase<slang::Diagnostic> *this,pointer pos,Diagnostic *args)

{
  undefined8 *puVar1;
  _Storage<unsigned_long,_true> *p_Var2;
  ulong uVar3;
  move_iterator<slang::Diagnostic_*> __first;
  pointer pvVar4;
  pointer pSVar5;
  pointer pDVar6;
  _Storage<unsigned_long,_true> _Var7;
  _Storage<unsigned_long,_true> _Var8;
  SourceLocation SVar9;
  Diagnostic *__result;
  ulong uVar10;
  move_iterator<slang::Diagnostic_*> __last;
  long lVar11;
  
  if (this->len != 0x124924924924924) {
    uVar10 = this->len + 1;
    uVar3 = this->cap;
    if (uVar10 < uVar3 * 2) {
      uVar10 = uVar3 * 2;
    }
    if (0x124924924924924 - uVar3 < uVar3) {
      uVar10 = 0x124924924924924;
    }
    lVar11 = (long)pos - (long)this->data_;
    __result = (Diagnostic *)operator_new(uVar10 * 0x70);
    pvVar4 = (args->args).
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(undefined8 *)((long)__result + lVar11) =
         (args->args).
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ((undefined8 *)((long)__result + lVar11))[1] = pvVar4;
    *(pointer *)((long)__result + lVar11 + 0x10) =
         (args->args).
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (args->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (args->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (args->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pSVar5 = (args->ranges).
             super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar1 = (undefined8 *)((long)__result + lVar11 + 0x18);
    *puVar1 = (args->ranges).
              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar1[1] = pSVar5;
    *(pointer *)((long)__result + lVar11 + 0x28) =
         (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pDVar6 = (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (undefined8 *)((long)__result + lVar11 + 0x30);
    *puVar1 = (args->notes).
              super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar1[1] = pDVar6;
    *(pointer *)((long)__result + lVar11 + 0x40) =
         (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(Symbol **)((long)__result + lVar11 + 0x68) = args->symbol;
    _Var7 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload;
    _Var8 = *(_Storage<unsigned_long,_true> *)
             &(args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
    SVar9 = args->location;
    puVar1 = (undefined8 *)((long)__result + lVar11 + 0x58);
    *puVar1 = *(undefined8 *)&args->code;
    *(SourceLocation *)(puVar1 + 1) = SVar9;
    p_Var2 = (_Storage<unsigned_long,_true> *)((long)__result + lVar11 + 0x48);
    *p_Var2 = _Var7;
    p_Var2[1] = _Var8;
    __first._M_current = this->data_;
    __last._M_current = __first._M_current + this->len;
    if (__last._M_current == pos) {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
                (__first,__last,__result);
    }
    else {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
                (__first,(move_iterator<slang::Diagnostic_*>)pos,__result);
      __last._M_current = this->data_ + this->len;
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
                ((move_iterator<slang::Diagnostic_*>)pos,__last,
                 (pointer)((long)__result + lVar11) + 1);
    }
    cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
    this->len = this->len + 1;
    this->cap = uVar10;
    this->data_ = __result;
    return (pointer)((long)__result + lVar11);
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}